

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O3

void __thiscall MmapReader::~MmapReader(MmapReader *this)

{
  uint64_t uVar1;
  void *__shmaddr;
  size_t sVar2;
  pointer pcVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  (this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter =
       (_func_int **)&PTR__MmapReader_001452d0;
  if ((this->super_MemoryReader).super_ReadWriter._readonly == false) {
    uVar1 = (this->super_MemoryReader)._size;
    std::__cxx11::string::_M_assign((string *)&this->_help);
    (this->_help).tsize = uVar1;
    (this->_help).trunc = true;
  }
  __shmaddr = (this->_region).m_base;
  if (__shmaddr != (void *)0x0) {
    if ((this->_region).m_is_xsi == true) {
      iVar4 = shmdt(__shmaddr);
      if (iVar4 != 0) {
        __assert_fail("ret == 0","/usr/include/boost/interprocess/mapped_region.hpp",0x344,
                      "void boost::interprocess::mapped_region::priv_close()");
      }
    }
    else {
      sVar2 = (this->_region).m_page_offset;
      munmap((void *)((long)__shmaddr - sVar2),sVar2 + (this->_region).m_size);
      (this->_region).m_base = (void *)0x0;
    }
  }
  iVar4 = (this->_file).m_handle;
  if (iVar4 != -1) {
    close(iVar4);
    (this->_file).m_handle = -1;
  }
  pcVar3 = (this->_file).m_filename._M_dataplus._M_p;
  paVar5 = &(this->_file).m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
  }
  file_helper::~file_helper(&this->_help);
  pcVar3 = (this->_filename)._M_dataplus._M_p;
  paVar5 = &(this->_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~MmapReader()
    {
        if (!isreadonly())
            _help.truncate(_filename, size());
    }